

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

Id_t __thiscall Potassco::AspifTextOutput::Data::addCondition(Data *this,LitSpan *cond)

{
  LitVec *this_00;
  ulong in_RAX;
  Id_t IVar1;
  undefined8 local_28;
  
  this_00 = &this->conditions;
  local_28 = in_RAX;
  if ((this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_28 = in_RAX & 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)((long)&local_28 + 4));
  }
  if (cond->size == 0) {
    IVar1 = 0;
  }
  else {
    IVar1 = (Id_t)((ulong)((long)(this->conditions).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->conditions).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    local_28 = CONCAT44(local_28._4_4_,(int)cond->size);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_28);
    std::vector<int,std::allocator<int>>::insert<int_const*,void>
              ((vector<int,std::allocator<int>> *)this_00,
               (const_iterator)
               (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,cond->first,cond->first + cond->size);
  }
  return IVar1;
}

Assistant:

Id_t addCondition(const LitSpan& cond) {
		if (conditions.empty()) { conditions.push_back(0); }
		if (empty(cond)) { return 0; }
		Id_t id = static_cast<Id_t>(conditions.size());
		conditions.push_back(static_cast<Lit_t>(size(cond)));
		conditions.insert(conditions.end(), begin(cond), end(cond));
		return id;
	}